

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O2

void __thiscall Assimp::LWOImporter::LoadLWO2Surface(LWOImporter *this,uint size)

{
  uint8_t **outFile;
  vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_> *this_00;
  pointer pSVar1;
  SubChunkHeader SVar2;
  uint *puVar3;
  __type _Var4;
  uint32_t uVar5;
  Logger *pLVar6;
  DeadlyImportError *pDVar7;
  uint uVar8;
  char *out;
  uint8_t *puVar9;
  uint8_t *puVar10;
  SubChunkHeader SVar11;
  allocator local_1a1;
  SubChunkHeader head2;
  string derived;
  
  puVar10 = this->mFileBuffer + size;
  this_00 = this->mSurfaces;
  LWO::Surface::Surface((Surface *)&derived);
  std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::
  emplace_back<Assimp::LWO::Surface>(this_00,(Surface *)&derived);
  LWO::Surface::~Surface((Surface *)&derived);
  pSVar1 = (this->mSurfaces->
           super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  GetS0(this,&pSVar1[-1].mName,size);
  derived._M_dataplus._M_p = (pointer)&derived.field_2;
  derived._M_string_length = 0;
  derived.field_2._M_local_buf[0] = '\0';
  out = (char *)&derived;
  GetS0(this,(string *)out,(int)puVar10 - *(int *)&this->mFileBuffer);
  if (derived._M_string_length != 0) {
    SVar2 = ((SubChunkHeader *)this->mSurfaces)[1];
    for (SVar11 = *(SubChunkHeader *)this->mSurfaces;
        SVar11 != (SubChunkHeader)((long)SVar2 + -0x148);
        SVar11 = (SubChunkHeader)((long)SVar11 + 0x148)) {
      out = (char *)&derived;
      _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              SVar11,&derived);
      if (_Var4) {
        LWO::Surface::operator=(pSVar1 + -1,(Surface *)SVar11);
        derived._M_string_length = 0;
        *derived._M_dataplus._M_p = '\0';
        out = (char *)SVar11;
        break;
      }
    }
    if (derived._M_string_length != 0) {
      pLVar6 = DefaultLogger::get();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&head2,
                     "LWO2: Unable to find source surface: ",&derived);
      out = (char *)head2;
      Logger::warn(pLVar6,(char *)head2);
      std::__cxx11::string::~string((string *)&head2);
    }
  }
  outFile = &this->mFileBuffer;
  puVar9 = *outFile;
  while( true ) {
    if (puVar10 <= puVar9 + 6) {
      std::__cxx11::string::~string((string *)&derived);
      return;
    }
    SVar11 = IFF::LoadSubChunk(outFile);
    puVar3 = (uint *)*outFile;
    puVar9 = (uint8_t *)(((ulong)SVar11 >> 0x20 & 0xffff) + (long)puVar3);
    if (puVar10 < puVar9) break;
    uVar8 = SVar11._4_4_ & 0xffff;
    uVar5 = SVar11.type;
    if (uVar5 == 0x41445452) {
      if (uVar8 < 4) {
        pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&head2,"LWO: ADTR chunk is too small",&local_1a1);
        DeadlyImportError::DeadlyImportError(pDVar7,(string *)&head2);
        __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar8 = *puVar3;
      *outFile = (uint8_t *)(puVar3 + 1);
      pSVar1[-1].mAdditiveTransparency =
           (float)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
    }
    else if (uVar5 == 0x424c4f4b) {
      if (uVar8 < 4) {
        pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&head2,"LWO: BLOK chunk is too small",&local_1a1);
        DeadlyImportError::DeadlyImportError(pDVar7,(string *)&head2);
        __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      head2 = IFF::LoadSubChunk(outFile);
      uVar5 = head2.type;
      if (((uVar5 == 0x47524144) || (uVar5 == 0x494d4150)) || (uVar5 == 0x50524f43)) {
        out = (char *)&head2;
        LoadLWO2TextureBlock(this,(SubChunkHeader *)out,uVar8);
      }
      else if (uVar5 == 0x53484452) {
        LoadLWO2ShaderBlock(this,(SubChunkHeader *)out,uVar8);
      }
      else {
        pLVar6 = DefaultLogger::get();
        out = "LWO2: Found an unsupported surface BLOK";
        Logger::warn(pLVar6,"LWO2: Found an unsupported surface BLOK");
      }
    }
    else if (uVar5 == 0x42554d50) {
      if (uVar8 < 4) {
        pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&head2,"LWO: BUMP chunk is too small",&local_1a1);
        DeadlyImportError::DeadlyImportError(pDVar7,(string *)&head2);
        __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar8 = *puVar3;
      *outFile = (uint8_t *)(puVar3 + 1);
      pSVar1[-1].mBumpIntensity =
           (float)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
    }
    else if (uVar5 == 0x434c5248) {
      if (uVar8 < 4) {
        pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&head2,"LWO: CLRH chunk is too small",&local_1a1);
        DeadlyImportError::DeadlyImportError(pDVar7,(string *)&head2);
        __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar8 = *puVar3;
      *outFile = (uint8_t *)(puVar3 + 1);
      pSVar1[-1].mColorHighlights =
           (float)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
    }
    else if (uVar5 == 0x56434f4c) {
      if (uVar8 < 0xc) {
        pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&head2,"LWO: VCOL chunk is too small",&local_1a1);
        DeadlyImportError::DeadlyImportError(pDVar7,(string *)&head2);
        __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar8 = *puVar3;
      this->mFileBuffer = (uint8_t *)(puVar3 + 1);
      pSVar1[-1].mDiffuseValue =
           (float)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18)
           * pSVar1[-1].mDiffuseValue;
      ReadVSizedIntLWO2(this,outFile);
      uVar8 = *(uint *)this->mFileBuffer;
      this->mFileBuffer = (uint8_t *)((long)this->mFileBuffer + 4);
      pSVar1[-1].mVCMapType =
           uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
      out = (char *)&pSVar1[-1].mVCMap;
      GetS0(this,&pSVar1[-1].mVCMap,(int)puVar9 - *(int *)&this->mFileBuffer);
    }
    else if (uVar5 == 0x44494646) {
      if (uVar8 < 4) {
        pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&head2,"LWO: DIFF chunk is too small",&local_1a1);
        DeadlyImportError::DeadlyImportError(pDVar7,(string *)&head2);
        __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar8 = *puVar3;
      *outFile = (uint8_t *)(puVar3 + 1);
      pSVar1[-1].mDiffuseValue =
           (float)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
    }
    else if (uVar5 == 0x474c4f53) {
      if (uVar8 < 4) {
        pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&head2,"LWO: GLOS chunk is too small",&local_1a1);
        DeadlyImportError::DeadlyImportError(pDVar7,(string *)&head2);
        __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar8 = *puVar3;
      *outFile = (uint8_t *)(puVar3 + 1);
      pSVar1[-1].mGlossiness =
           (float)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
    }
    else if (uVar5 == 0x4c494e45) {
      if (uVar8 < 2) {
        pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&head2,"LWO: LINE chunk is too small",&local_1a1);
        DeadlyImportError::DeadlyImportError(pDVar7,(string *)&head2);
        __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar8 = *puVar3;
      *outFile = (uint8_t *)((long)puVar3 + 2);
      if (((ushort)uVar8 >> 8 & 1) != 0) {
        pSVar1[-1].mWireframe = true;
      }
    }
    else if (uVar5 == 0x52494e44) {
      if (uVar8 < 4) {
        pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&head2,"LWO: RIND chunk is too small",&local_1a1);
        DeadlyImportError::DeadlyImportError(pDVar7,(string *)&head2);
        __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar8 = *puVar3;
      *outFile = (uint8_t *)(puVar3 + 1);
      pSVar1[-1].mIOR =
           (float)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
    }
    else if (uVar5 == 0x53494445) {
      if (uVar8 < 2) {
        pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&head2,"LWO: SIDE chunk is too small",&local_1a1);
        DeadlyImportError::DeadlyImportError(pDVar7,(string *)&head2);
        __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar8 = *puVar3;
      *outFile = (uint8_t *)((long)puVar3 + 2);
      pSVar1[-1].bDoubleSided = (ushort)uVar8 == 0x300;
    }
    else if (uVar5 == 0x534d414e) {
      if (uVar8 < 4) {
        pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&head2,"LWO: SMAN chunk is too small",&local_1a1);
        DeadlyImportError::DeadlyImportError(pDVar7,(string *)&head2);
        __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar8 = *puVar3;
      *outFile = (uint8_t *)(puVar3 + 1);
      pSVar1[-1].mMaximumSmoothAngle =
           (float)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                  (uVar8 & 0x7f) << 0x18);
    }
    else if (uVar5 == 0x53504543) {
      if (uVar8 < 4) {
        pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&head2,"LWO: SPEC chunk is too small",&local_1a1);
        DeadlyImportError::DeadlyImportError(pDVar7,(string *)&head2);
        __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar8 = *puVar3;
      *outFile = (uint8_t *)(puVar3 + 1);
      pSVar1[-1].mSpecularValue =
           (float)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
    }
    else if (uVar5 == 0x5452414e) {
      if ((pSVar1[-1].mTransparency != 1e+11) || (NAN(pSVar1[-1].mTransparency))) {
        if (uVar8 < 4) {
          pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string((string *)&head2,"LWO: TRAN chunk is too small",&local_1a1);
          DeadlyImportError::DeadlyImportError(pDVar7,(string *)&head2);
          __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar8 = *puVar3;
        *outFile = (uint8_t *)(puVar3 + 1);
        pSVar1[-1].mTransparency =
             (float)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18
                    );
      }
    }
    else if (uVar5 == 0x434f4c52) {
      if (uVar8 < 0xc) {
        pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&head2,"LWO: COLR chunk is too small",&local_1a1);
        DeadlyImportError::DeadlyImportError(pDVar7,(string *)&head2);
        __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar8 = *puVar3;
      *outFile = (uint8_t *)(puVar3 + 1);
      pSVar1[-1].mColor.r =
           (ai_real)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18
                    );
      uVar8 = *(uint *)*outFile;
      *outFile = (uint8_t *)((long)*outFile + 4);
      pSVar1[-1].mColor.g =
           (ai_real)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18
                    );
      uVar8 = *(uint *)*outFile;
      *outFile = (uint8_t *)((long)*outFile + 4);
      pSVar1[-1].mColor.b =
           (ai_real)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18
                    );
    }
    *outFile = puVar9;
  }
  pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&head2,"LWO2: Invalid surface chunk length",&local_1a1);
  DeadlyImportError::DeadlyImportError(pDVar7,(string *)&head2);
  __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void LWOImporter::LoadLWO2Surface(unsigned int size)
{
    LE_NCONST uint8_t* const end = mFileBuffer + size;

    mSurfaces->push_back( LWO::Surface () );
    LWO::Surface& surf = mSurfaces->back();

    GetS0(surf.mName,size);

    // check whether this surface was derived from any other surface
    std::string derived;
    GetS0(derived,(unsigned int)(end - mFileBuffer));
    if (derived.length())   {
        // yes, find this surface
        for (SurfaceList::iterator it = mSurfaces->begin(), end = mSurfaces->end()-1; it != end; ++it)  {
            if ((*it).mName == derived) {
                // we have it ...
                surf = *it;
                derived.clear();break;
            }
        }
        if (derived.size())
            ASSIMP_LOG_WARN("LWO2: Unable to find source surface: " + derived);
    }

    while (true)
    {
        if (mFileBuffer + 6 >= end)
            break;
        const IFF::SubChunkHeader head = IFF::LoadSubChunk(mFileBuffer);

        if (mFileBuffer + head.length > end)
            throw DeadlyImportError("LWO2: Invalid surface chunk length");

        uint8_t* const next = mFileBuffer+head.length;
        switch (head.type)
        {
            // diffuse color
        case AI_LWO_COLR:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,COLR,12);
                surf.mColor.r = GetF4();
                surf.mColor.g = GetF4();
                surf.mColor.b = GetF4();
                break;
            }
            // diffuse strength ... hopefully
        case AI_LWO_DIFF:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,DIFF,4);
                surf.mDiffuseValue = GetF4();
                break;
            }
            // specular strength ... hopefully
        case AI_LWO_SPEC:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,SPEC,4);
                surf.mSpecularValue = GetF4();
                break;
            }
            // transparency
        case AI_LWO_TRAN:
            {
                // transparency explicitly disabled?
                if (surf.mTransparency == 10e10f)
                    break;

                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,TRAN,4);
                surf.mTransparency = GetF4();
                break;
            }
            // additive transparency
        case AI_LWO_ADTR:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,ADTR,4);
                surf.mAdditiveTransparency = GetF4();
                break;
            }
            // wireframe mode
        case AI_LWO_LINE:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,LINE,2);
                if (GetU2() & 0x1)
                    surf.mWireframe = true;
                break;
            }
            // glossiness
        case AI_LWO_GLOS:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,GLOS,4);
                surf.mGlossiness = GetF4();
                break;
            }
            // bump intensity
        case AI_LWO_BUMP:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,BUMP,4);
                surf.mBumpIntensity = GetF4();
                break;
            }
            // color highlights
        case AI_LWO_CLRH:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,CLRH,4);
                surf.mColorHighlights = GetF4();
                break;
            }
            // index of refraction
        case AI_LWO_RIND:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,RIND,4);
                surf.mIOR = GetF4();
                break;
            }
            // polygon sidedness
        case AI_LWO_SIDE:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,SIDE,2);
                surf.bDoubleSided = (3 == GetU2());
                break;
            }
            // maximum smoothing angle
        case AI_LWO_SMAN:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,SMAN,4);
                surf.mMaximumSmoothAngle = std::fabs( GetF4() );
                break;
            }
            // vertex color channel to be applied to the surface
        case AI_LWO_VCOL:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,VCOL,12);
                surf.mDiffuseValue *= GetF4();              // strength
                ReadVSizedIntLWO2(mFileBuffer);             // skip envelope
                surf.mVCMapType = GetU4();                  // type of the channel

                // name of the channel
                GetS0(surf.mVCMap, (unsigned int) (next - mFileBuffer ));
                break;
            }
            // surface bock entry
        case AI_LWO_BLOK:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,BLOK,4);
                IFF::SubChunkHeader head2 = IFF::LoadSubChunk(mFileBuffer);

                switch (head2.type)
                {
                case AI_LWO_PROC:
                case AI_LWO_GRAD:
                case AI_LWO_IMAP:
                    LoadLWO2TextureBlock(&head2, head.length);
                    break;
                case AI_LWO_SHDR:
                    LoadLWO2ShaderBlock(&head2, head.length);
                    break;

                default:
                    ASSIMP_LOG_WARN("LWO2: Found an unsupported surface BLOK");
                };

                break;
            }
        }
        mFileBuffer = next;
    }
}